

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

timestamp_t
duckdb::TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
          (interval_t bucket_width,timestamp_t ts,interval_t offset)

{
  bool bVar1;
  int64_t bucket_width_micros;
  timestamp_t tVar2;
  int64_t ts_micros;
  int64_t extraout_RDX;
  interval_t iVar3;
  interval_t local_30;
  
  local_30.micros = bucket_width.micros;
  local_30._0_8_ = bucket_width._0_8_;
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(ts);
  if (bVar1) {
    bucket_width_micros = Interval::GetMicro(&local_30);
    tVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(ts);
    iVar3.micros = extraout_RDX;
    iVar3.months = (int)offset.micros;
    iVar3.days = (int)((ulong)offset.micros >> 0x20);
    iVar3 = Interval::Invert(offset._0_8_,iVar3);
    tVar2 = Interval::Add(tVar2,iVar3);
    ts_micros = Timestamp::GetEpochMicroSeconds(tVar2);
    tVar2 = WidthConvertibleToMicrosCommon(bucket_width_micros,ts_micros,0x35d2976e6a000);
    tVar2 = Interval::Add(tVar2,offset);
    tVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(tVar2);
    return (timestamp_t)tVar2.value;
  }
  tVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(ts);
  return (timestamp_t)tVar2.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(
			    Interval::Add(Cast::template Operation<TB, timestamp_t>(ts), Interval::Invert(offset)));
			return Cast::template Operation<timestamp_t, TR>(Interval::Add(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, DEFAULT_ORIGIN_MICROS), offset));
		}